

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O3

void CalculateGamma(double gamma,Uint16 *ramp)

{
  Uint16 UVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  lVar3 = 0;
  do {
    dVar4 = pow((double)(int)lVar3 * 0.00390625,1.0 / gamma);
    iVar2 = (int)(dVar4 * 65535.0 + 0.5);
    UVar1 = (Uint16)iVar2;
    if (0xfffe < iVar2) {
      UVar1 = 0xffff;
    }
    ramp[lVar3] = UVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

void CalculateGamma(double gamma, Uint16 *ramp)
{
	int i, value;

	gamma = 1.0 / gamma;
	for ( i=0; i<256; ++i ) {
		value = (int)(pow((double)i/256.0, gamma)*65535.0 + 0.5);
		if ( value > 65535 ) {
			value = 65535;
		}
		ramp[i] = (Uint16)value;
	}
}